

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::GenericSwap(MessageLite *m1,MessageLite *m2)

{
  pointer pMVar1;
  type pMVar2;
  unique_ptr<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
  *in_RSI;
  long *in_RDI;
  unique_ptr<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_> tmp
  ;
  pointer in_stack_ffffffffffffffb8;
  unique_ptr<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
  *in_stack_ffffffffffffffc0;
  
  (**(code **)(*in_RDI + 0x18))();
  std::unique_ptr<google::protobuf::MessageLite,std::default_delete<google::protobuf::MessageLite>>
  ::unique_ptr<std::default_delete<google::protobuf::MessageLite>,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pMVar1 = std::
           unique_ptr<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
           ::operator->((unique_ptr<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
                         *)0x40f658);
  (*pMVar1->_vptr_MessageLite[8])(pMVar1,in_RDI);
  (**(code **)(*in_RDI + 0x28))();
  (**(code **)(*in_RDI + 0x40))(in_RDI,in_RSI);
  (*(code *)(in_RSI->_M_t).
            super___uniq_ptr_impl<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::MessageLite_*,_std::default_delete<google::protobuf::MessageLite>_>
            .super__Head_base<0UL,_google::protobuf::MessageLite_*,_false>._M_head_impl[2].
            _internal_metadata_.ptr_)();
  pMVar2 = std::
           unique_ptr<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
           ::operator*(in_RSI);
  (*(code *)(in_RSI->_M_t).
            super___uniq_ptr_impl<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::MessageLite_*,_std::default_delete<google::protobuf::MessageLite>_>
            .super__Head_base<0UL,_google::protobuf::MessageLite_*,_false>._M_head_impl[4].
            _vptr_MessageLite)(in_RSI,pMVar2);
  std::
  unique_ptr<google::protobuf::MessageLite,_std::default_delete<google::protobuf::MessageLite>_>::
  ~unique_ptr(in_RSI);
  return;
}

Assistant:

void GenericSwap(MessageLite* m1, MessageLite* m2) {
  std::unique_ptr<MessageLite> tmp(m1->New());
  tmp->CheckTypeAndMergeFrom(*m1);
  m1->Clear();
  m1->CheckTypeAndMergeFrom(*m2);
  m2->Clear();
  m2->CheckTypeAndMergeFrom(*tmp);
}